

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryFill
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,MemoryFill *curr)

{
  Name memory;
  ulong uVar1;
  undefined1 this_00 [8];
  bool bVar2;
  int32_t iVar3;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar4;
  uint64_t uVar5;
  address64_t aVar6;
  address64_t aVar7;
  address64_t aVar8;
  Literal *this_01;
  ExternalInterface *pEVar9;
  Literal local_198;
  address64_t local_180;
  ulong local_178;
  size_t i;
  uint8_t val;
  Address local_150;
  Address memorySize;
  undefined1 local_130 [8];
  MemoryInstanceInfo info;
  Address sizeVal;
  Address destVal;
  Flow size;
  Flow value;
  undefined1 local_68 [8];
  Flow dest;
  MemoryFill *curr_local;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar4 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_68,pEVar4,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x10))
  ;
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    goto LAB_001a5ecc;
  }
  pEVar4 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar4,
             *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x18));
  bVar2 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
  }
  else {
    pEVar4 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&destVal,pEVar4,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20));
    bVar2 = Flow::breaking((Flow *)&destVal);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&destVal);
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      uVar5 = ::wasm::Literal::getUnsigned();
      Address::Address(&sizeVal,uVar5);
      Flow::getSingleValue((Flow *)&destVal);
      uVar5 = ::wasm::Literal::getUnsigned();
      Address::Address((Address *)&info.name.super_IString.str._M_str,uVar5);
      memorySize.addr = (((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str)._M_len;
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_130,this,
                 (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str);
      memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
      memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
      memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
      memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
      local_150 = getMemorySize((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                local_130,memory);
      aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
      aVar7 = Address::operator_cast_to_unsigned_long(&local_150);
      if (aVar7 << 0x10 < aVar6) {
LAB_001a5cfc:
        (*(this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
          _vptr_ExpressionRunner[2])(this,"out of bounds memory access in memory.fill");
      }
      else {
        aVar6 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar7 = Address::operator_cast_to_unsigned_long(&local_150);
        if (aVar7 << 0x10 < aVar6) goto LAB_001a5cfc;
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long(&local_150);
        if (aVar8 << 0x10 < aVar6 + aVar7) goto LAB_001a5cfc;
      }
      this_01 = Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
      iVar3 = wasm::Literal::geti32(this_01);
      i._7_1_ = (char)iVar3;
      local_178 = 0;
      while( true ) {
        uVar1 = local_178;
        aVar6 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        if (aVar6 <= uVar1) break;
        pEVar9 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_130);
        this_00 = local_130;
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        wasm::Literal::Literal(&local_198,aVar6 + local_178);
        local_180 = (address64_t)
                    getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                               this_00,&local_198,1,local_150);
        (*pEVar9->_vptr_ExternalInterface[0x16])
                  (pEVar9,local_180,(ulong)(uint)(int)i._7_1_,
                   CONCAT44(info.instance._4_4_,info.instance._0_4_),
                   CONCAT44(info.name.super_IString.str._M_len._4_4_,
                            (undefined4)info.name.super_IString.str._M_len));
        ::wasm::Literal::~Literal(&local_198);
        local_178 = local_178 + 1;
      }
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&destVal);
  }
  Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
LAB_001a5ecc:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryFill(MemoryFill* curr) {
    NOTE_ENTER("MemoryFill");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(value);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    // FIXME: cheaper wrapping detection?
    if (destVal > memorySize * Memory::kPageSize ||
        sizeVal > memorySize * Memory::kPageSize ||
        destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.fill");
    }
    uint8_t val(value.getSingleValue().geti32());
    for (size_t i = 0; i < sizeVal; ++i) {
      info.interface()->store8(info.instance->getFinalAddressWithoutOffset(
                                 Literal(destVal + i), 1, memorySize),
                               val,
                               info.name);
    }
    return {};
  }